

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O0

int main(void)

{
  anon_enum_32 aVar1;
  int local_4c;
  duration<long,_std::ratio<1L,_1000L>_> local_48;
  undefined1 local_40 [8];
  Coro coroutine;
  
  coroutine.super_EboIndex<5UL>.index._4_4_ = 0;
  memset(local_40,0,0x30);
  SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>::SCoro
            ((SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime> *)local_40);
  do {
    while (aVar1 = SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>::
                   Poll((SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime> *)
                        local_40), aVar1 != End) {
      printf("-");
      local_4c = 10;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_48,&local_4c);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_48);
    }
    printf("\n\n");
    SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>::Reset<>
              ((SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime> *)local_40)
    ;
  } while( true );
}

Assistant:

int main()
{
    auto coroutine = Coro{};
    while (true)
    {
        while (coroutine.Poll())
        {
            std::printf("-");
            std::this_thread::sleep_for(std::chrono::milliseconds{10});
        }
        std::printf("\n\n");
        coroutine.Reset();
    }
    return 0;
}